

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

string * __thiscall
cli::Parser::CmdArgument<bool>::print_value_abi_cxx11_
          (string *__return_storage_ptr__,CmdArgument<bool> *this)

{
  bool bVar1;
  string *__str;
  
  bVar1 = this->value;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p,1,(uint)bVar1);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string print_value() const {
				return stringify(value);
			}